

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

bool __thiscall DLoadMenu::MenuEvent(DLoadMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  bVar1 = DLoadSaveMenu::MenuEvent(&this->super_DLoadSaveMenu,mkey,fromcontroller);
  bVar2 = true;
  if (!bVar1) {
    lVar3 = (long)(this->super_DLoadSaveMenu).Selected;
    bVar2 = false;
    if (((lVar3 != -1) && (bVar2 = false, mkey == 6)) &&
       (bVar2 = false, DLoadSaveMenu::SaveGames.Count != 0)) {
      G_LoadGame((DLoadSaveMenu::SaveGames.Array[lVar3]->Filename).Chars,true);
      if (quickSaveSlot == (FSaveGameNode *)0x1) {
        quickSaveSlot = DLoadSaveMenu::SaveGames.Array[(this->super_DLoadSaveMenu).Selected];
      }
      M_ClearMenus();
      V_SetBorderNeedRefresh();
      DLoadSaveMenu::LastAccessed = (this->super_DLoadSaveMenu).Selected;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool DLoadMenu::MenuEvent (int mkey, bool fromcontroller)
{
	if (Super::MenuEvent(mkey, fromcontroller)) 
	{
		return true;
	}
	if (Selected == -1 || SaveGames.Size() == 0)
	{
		return false;
	}

	if (mkey == MKEY_Enter)
	{
		G_LoadGame (SaveGames[Selected]->Filename.GetChars(), true);
		if (quickSaveSlot == (FSaveGameNode*)1)
		{
			quickSaveSlot = SaveGames[Selected];
		}
		M_ClearMenus();
		V_SetBorderNeedRefresh();
		LastAccessed = Selected;
		return true;
	}
	return false;
}